

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O3

bool __thiscall TGAImage::unload_rle_data(TGAImage *this,ofstream *out)

{
  bool bVar1;
  ulong uVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  uVar7 = (ulong)(this->height * this->width);
  uVar2 = 0;
  do {
    uVar8 = uVar2;
    if (uVar7 <= uVar8) goto LAB_0010300c;
    uVar2 = (ulong)this->bytespp;
    puVar3 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = puVar3 + (uVar8 + 1) * uVar2;
    puVar3 = puVar3 + uVar8 * uVar2;
    bVar1 = true;
    uVar5 = 1;
    do {
      uVar9 = uVar5 & 0xffffffff;
      if (((char)uVar5 < '\0') || (uVar7 <= uVar5 + uVar8)) break;
      if (uVar2 == 0) {
        bVar11 = true;
      }
      else {
        uVar6 = 1;
        do {
          bVar11 = puVar3[uVar6 - 1] == puVar4[uVar6 - 1];
          if (!bVar11) break;
          bVar10 = uVar6 < uVar2;
          uVar6 = uVar6 + 1;
        } while (bVar10);
      }
      if (uVar5 == 1) {
        bVar1 = (bool)(bVar11 ^ 1U);
      }
      if ((!(bool)(bVar11 ^ 1U)) && (bVar1)) {
        uVar9 = (ulong)((int)uVar5 - 1);
        break;
      }
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + uVar2;
      puVar3 = puVar3 + uVar2;
    } while (bVar11 || bVar1);
    std::ostream::put((char)out);
    if (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) != 0) break;
    std::ostream::write((char *)out,
                        (long)((this->data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar8 * uVar2));
    uVar2 = (uVar9 & 0xff) + uVar8;
  } while (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) == 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"can\'t dump the tga file\n",0x18);
LAB_0010300c:
  return uVar7 <= uVar8;
}

Assistant:

bool TGAImage::unload_rle_data(std::ofstream &out) const
{
    const std::uint8_t max_chunk_length = 128;
    size_t n_pixels = width * height;
    size_t curpix = 0;
    while (curpix < n_pixels) {
        size_t chunkstart = curpix * bytespp;
        size_t curbyte = curpix * bytespp;
        std::uint8_t run_length = 1;
        bool raw = true;
        while (curpix + run_length < n_pixels && run_length < max_chunk_length) {
            bool succ_eq = true;
            for (size_t t = 0; succ_eq && t < bytespp; t++)
                succ_eq = (data[curbyte + t] == data[curbyte + t + bytespp]);
            curbyte += bytespp;
            if (1 == run_length) raw = !succ_eq;
            if (raw && succ_eq) {
                run_length--;
                break;
            }
            if (!raw && !succ_eq) break;
            run_length++;
        }
        curpix += run_length;
        out.put(raw ? run_length - 1 : run_length + 127);
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
        out.write(reinterpret_cast<const char *>(data.data() + chunkstart),
                  (raw ? run_length * bytespp : bytespp));
        if (!out.good()) {
            std::cerr << "can't dump the tga file\n";
            return false;
        }
    }
    return true;
}